

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

string * __thiscall
Corrade::Utility::String::Implementation::joinWithoutEmptyParts
          (string *__return_storage_ptr__,Implementation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *strings,ArrayView<const_char> delimiter)

{
  size_type sVar1;
  size_type sVar2;
  const_reference other;
  BasicStringView<const_char> *pBVar3;
  StringIterable local_c0;
  StringViewFlags local_98;
  BasicStringView<const_char> local_90;
  String local_80;
  char *local_58;
  size_t local_50;
  size_type local_48;
  size_t i;
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  stringViews;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *strings_local;
  ArrayView<const_char> delimiter_local;
  
  delimiter_local._data = delimiter._data;
  stringViews._deleter = (_func_void_BasicStringView<const_char>_ptr_unsigned_long *)this;
  strings_local = strings;
  delimiter_local._size = (size_t)__return_storage_ptr__;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this);
  Containers::
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  ::Array((Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
           *)&i,sVar1);
  local_48 = 0;
  while( true ) {
    sVar1 = local_48;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)stringViews._deleter);
    if (sVar1 == sVar2) break;
    other = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)stringViews._deleter,local_48);
    Containers::BasicStringView<char_const>::
    BasicStringView<std::__cxx11::string_const&,Corrade::Containers::BasicStringView<char_const>>
              ((BasicStringView<char_const> *)&local_58,other);
    pBVar3 = Containers::
             Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
             ::operator[]<unsigned_long,_0>
                       ((Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
                         *)&i,local_48);
    pBVar3->_data = local_58;
    pBVar3->_sizePlusFlags = local_50;
    local_48 = local_48 + 1;
  }
  Containers::EnumSet<Corrade::Containers::StringViewFlag,_13835058055282163712UL>::EnumSet
            (&local_98);
  Containers::BasicStringView<char_const>::
  BasicStringView<Corrade::Containers::ArrayView<char_const>const&,Corrade::Containers::ArrayView<char_const>>
            ((BasicStringView<char_const> *)&local_90,(ArrayView<const_char> *)&strings_local,
             local_98);
  Containers::StringIterable::
  StringIterable<Corrade::Containers::Array<Corrade::Containers::BasicStringView<char_const>,void(*)(Corrade::Containers::BasicStringView<char_const>*,unsigned_long)>&,Corrade::Containers::StringIterable>
            (&local_c0,
             (Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
              *)&i);
  Containers::BasicStringView<const_char>::joinWithoutEmptyParts(&local_80,&local_90,&local_c0);
  Containers::String::operator_cast_to_string(__return_storage_ptr__,&local_80);
  Containers::String::~String(&local_80);
  Containers::
  Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
  ::~Array((Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
            *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string joinWithoutEmptyParts(const std::vector<std::string>& strings, const Containers::ArrayView<const char> delimiter) {
    /* IDGAF that this has two extra allocations due to the Array being created
       and then the String converted to a std::string vector, the input
       std::string instances are MUCH worse */
    Containers::Array<Containers::StringView> stringViews{strings.size()};
    for(std::size_t i = 0; i != strings.size(); ++i)
        stringViews[i] = strings[i];
    return Containers::StringView{delimiter}.joinWithoutEmptyParts(stringViews);
}